

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::Areal_Object_State_PDU
          (Areal_Object_State_PDU *this,KUINT8 Modification,ObjectType *T,ArealObjectAppearance *A,
          SimulationIdentifier *RequestorID,SimulationIdentifier *ReceivingID)

{
  SimulationIdentifier *ReceivingID_local;
  SimulationIdentifier *RequestorID_local;
  ArealObjectAppearance *A_local;
  ObjectType *T_local;
  KUINT8 Modification_local;
  Areal_Object_State_PDU *this_local;
  
  Object_State_Header::Object_State_Header(&this->super_Object_State_Header);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Areal_Object_State_PDU_0032fa68;
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp,T);
  DATA_TYPE::ArealObjectAppearance::ArealObjectAppearance(&this->m_Apperance,A);
  this->m_ui16NumPoints = 0;
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID,RequestorID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID,ReceivingID);
  std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ::vector(&this->m_vPoints);
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = '-';
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength = 0x30;
  (this->super_Object_State_Header).field_0x4b = Modification;
  return;
}

Assistant:

Areal_Object_State_PDU::Areal_Object_State_PDU( KUINT8 Modification, const ObjectType & T, const ArealObjectAppearance & A,
        const SimulationIdentifier & RequestorID, const SimulationIdentifier & ReceivingID ) :
    m_ObjTyp( T ),
    m_Apperance( A ),
    m_ui16NumPoints( 0 ),
    m_ReqID( RequestorID ),
    m_RecvID(ReceivingID )
{
    m_ui8PDUType = ArealObjectState_PDU_Type;
    m_ui16PDULength = AREAL_OBJECT_STATE_PDU_SIZE;
    m_ModificationUnion.m_ui8Modifications = Modification;
}